

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O2

void __thiscall
kj::_::ExceptionOr<kj::Promise<NoCopy>_>::~ExceptionOr(ExceptionOr<kj::Promise<NoCopy>_> *this)

{
  if ((this->value).ptr.isSet == true) {
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
              ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&(this->value).ptr.field_1.value);
  }
  NullableValue<kj::Exception>::~NullableValue((NullableValue<kj::Exception> *)this);
  return;
}

Assistant:

ExceptionOr() = default;